

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_resampler_init_preallocated
                    (ma_resampler_config *pConfig,void *pHeap,ma_resampler *pResampler)

{
  ma_uint32 mVar1;
  ma_uint32 mVar2;
  ma_uint32 mVar3;
  ma_result mVar4;
  ma_resampling_backend_vtable *pmVar5;
  ma_resampler *pmVar6;
  
  if (pResampler == (ma_resampler *)0x0) {
    return MA_INVALID_ARGS;
  }
  memset(pResampler,0,0xc0);
  if (pConfig == (ma_resampler_config *)0x0) {
    return MA_INVALID_ARGS;
  }
  pResampler->_pHeap = pHeap;
  mVar1 = pConfig->channels;
  mVar2 = pConfig->sampleRateIn;
  mVar3 = pConfig->sampleRateOut;
  pResampler->format = pConfig->format;
  pResampler->channels = mVar1;
  pResampler->sampleRateIn = mVar2;
  pResampler->sampleRateOut = mVar3;
  pResampler->pBackendVTable = (ma_resampling_backend_vtable *)0x0;
  pResampler->pBackendUserData = (void *)0x0;
  if (pConfig->algorithm == ma_resample_algorithm_custom) {
    pmVar5 = pConfig->pBackendVTable;
    pResampler->pBackendVTable = pmVar5;
    pmVar6 = (ma_resampler *)pConfig->pBackendUserData;
    pResampler->pBackendUserData = pmVar6;
    if (pmVar5 == (ma_resampling_backend_vtable *)0x0) {
      return MA_NOT_IMPLEMENTED;
    }
  }
  else {
    if (pConfig->algorithm != ma_resample_algorithm_linear) {
      return MA_INVALID_ARGS;
    }
    pmVar5 = &g_ma_linear_resampler_vtable;
    pResampler->pBackendVTable = &g_ma_linear_resampler_vtable;
    pResampler->pBackendUserData = pResampler;
    pmVar6 = pResampler;
  }
  if (pmVar5->onInit ==
      (_func_ma_result_void_ptr_ma_resampler_config_ptr_void_ptr_ma_resampling_backend_ptr_ptr *)0x0
     ) {
    return MA_NOT_IMPLEMENTED;
  }
  mVar4 = (*pmVar5->onInit)(pmVar6,pConfig,pHeap,&pResampler->pBackend);
  return mVar4;
}

Assistant:

MA_API ma_result ma_resampler_init_preallocated(const ma_resampler_config* pConfig, void* pHeap, ma_resampler* pResampler)
{
    ma_result result;

    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pResampler);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    pResampler->_pHeap        = pHeap;
    pResampler->format        = pConfig->format;
    pResampler->channels      = pConfig->channels;
    pResampler->sampleRateIn  = pConfig->sampleRateIn;
    pResampler->sampleRateOut = pConfig->sampleRateOut;

    result = ma_resampler_get_vtable(pConfig, pResampler, &pResampler->pBackendVTable, &pResampler->pBackendUserData);
    if (result != MA_SUCCESS) {
        return result;
    }

    if (pResampler->pBackendVTable == NULL || pResampler->pBackendVTable->onInit == NULL) {
        return MA_NOT_IMPLEMENTED;  /* onInit not implemented. */
    }

    result = pResampler->pBackendVTable->onInit(pResampler->pBackendUserData, pConfig, pHeap, &pResampler->pBackend);
    if (result != MA_SUCCESS) {
        return result;
    }

    return MA_SUCCESS;
}